

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O0

Convergence_Data * __thiscall
Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>::solve_system
          (Convergence_Data *__return_storage_ptr__,
          Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *this,
          Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
          Vector_Dense<double,_0UL> *b_vector)

{
  bool bVar1;
  Convergence_Data *convergence_data;
  Vector_Dense<double,_0UL> *b_vector_local;
  Vector_Dense<double,_0UL> *x_vector_local;
  Matrix_Sparse *a_matrix_local;
  Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *this_local;
  
  memset(__return_storage_ptr__,0,0x50);
  Convergence_Data::Convergence_Data(__return_storage_ptr__);
  while( true ) {
    bVar1 = Convergence_Criteria::is_converged((Convergence_Criteria *)this,__return_storage_ptr__);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    forward_sweep(a_matrix,x_vector,x_vector,b_vector,1.5);
    Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
              (__return_storage_ptr__,a_matrix,x_vector,b_vector);
  }
  return __return_storage_ptr__;
}

Assistant:

Convergence_Data Solver_Fixed_Point<Solver_Type::successive_over_relaxation, Solver_Fixed_Point_Sor_Data>::solve_system(
const Matrix_Sparse& a_matrix, Vector_Dense<Scalar, 0>& x_vector, const Vector_Dense<Scalar, 0>& b_vector) {
  Convergence_Data convergence_data = Convergence_Data();
  while(!data.limits.is_converged(convergence_data)) {
    forward_sweep(a_matrix, x_vector, x_vector, b_vector, 1.5);
    convergence_data.update(a_matrix, x_vector, b_vector);
  }

  return convergence_data;
}